

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

bool absl::lts_20250127::str_format_internal::ConvertIntArg<absl::lts_20250127::uint128>
               (uint128 v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  uint128 v_00;
  uint128 v_01;
  uint128 v_02;
  uint128 v_03;
  uint128 v_04;
  undefined8 this;
  FormatConversionChar FVar1;
  LengthMod LVar2;
  char cVar3;
  bool bVar4;
  wchar_t wVar5;
  uint64_t uVar6;
  double v_05;
  string_view v_06;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  bool local_151;
  undefined1 local_90 [8];
  IntDigits as_digits;
  FormatSinkImpl *sink_local;
  IntDigits *local_38;
  FormatConversionSpecImpl conv_local;
  uint128 v_local;
  bool local_9;
  
  conv_local._0_4_ = conv.precision_;
  local_38 = conv._0_8_;
  uVar6 = v.hi_;
  register0x00000038 = v.lo_;
  as_digits._56_8_ = sink;
  FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)&local_38);
  switch(FVar1) {
  case 0:
    LVar2 = FormatConversionSpecImpl::length_mod((FormatConversionSpecImpl *)&local_38);
    if (LVar2 == l) {
      wVar5 = uint128::operator_cast_to_wchar_t((uint128 *)&conv_local.precision_);
      conv_00.width_ = 0;
      conv_00.conv_ = conv_local.conv_;
      conv_00.flags_ = conv_local.flags_;
      conv_00.length_mod_ = conv_local.length_mod_;
      conv_00._3_1_ = conv_local._3_1_;
      conv_00.precision_ = as_digits.storage_._40_4_;
      local_151 = anon_unknown_53::ConvertWCharTImpl
                            ((anon_unknown_53 *)(ulong)(uint)wVar5,(wchar_t)local_38,conv_00,sink);
    }
    else {
      cVar3 = uint128::operator_cast_to_char((uint128 *)&conv_local.precision_);
      conv_01.width_ = 0;
      conv_01.conv_ = conv_local.conv_;
      conv_01.flags_ = conv_local.flags_;
      conv_01.length_mod_ = conv_local.length_mod_;
      conv_01._3_1_ = conv_local._3_1_;
      conv_01.precision_ = as_digits.storage_._40_4_;
      local_151 = anon_unknown_53::ConvertCharImpl
                            ((anon_unknown_53 *)(ulong)(uint)(int)cVar3,(char)local_38,conv_01,sink)
      ;
    }
    return local_151;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = absl::uint128]"
                 );
  case 2:
  case 3:
  case 0x12:
    v_00.hi_ = uVar6;
    v_00.lo_ = stack0xffffffffffffffd8;
    anon_unknown_53::IntDigits::PrintAsDec((IntDigits *)local_90,v_00,false);
    break;
  case 4:
    v_04.hi_ = uVar6;
    v_04.lo_ = stack0xffffffffffffffd8;
    anon_unknown_53::IntDigits::PrintAsOct<absl::lts_20250127::uint128>((IntDigits *)local_90,v_04);
    break;
  case 5:
    v_01.hi_ = uVar6;
    v_01.lo_ = stack0xffffffffffffffd8;
    anon_unknown_53::IntDigits::PrintAsDec((IntDigits *)local_90,v_01,false);
    break;
  case 6:
    v_03.hi_ = uVar6;
    v_03.lo_ = stack0xffffffffffffffd8;
    anon_unknown_53::IntDigits::PrintAsHexLower<absl::lts_20250127::uint128>
              ((IntDigits *)local_90,v_03);
    break;
  case 7:
    v_02.hi_ = uVar6;
    v_02.lo_ = stack0xffffffffffffffd8;
    anon_unknown_53::IntDigits::PrintAsHexUpper<absl::lts_20250127::uint128>
              ((IntDigits *)local_90,v_02);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    v_05 = uint128::operator_cast_to_double((uint128 *)&conv_local.precision_);
    bVar4 = ConvertFloatImpl(v_05,(FormatConversionSpecImpl *)&local_38,
                             (FormatSinkImpl *)as_digits._56_8_);
    return bVar4;
  }
  bVar4 = FormatConversionSpecImpl::is_basic((FormatConversionSpecImpl *)&local_38);
  this = as_digits._56_8_;
  if (bVar4) {
    v_06 = anon_unknown_53::IntDigits::with_neg_and_zero((IntDigits *)local_90);
    FormatSinkImpl::Append((FormatSinkImpl *)this,v_06);
    local_9 = true;
  }
  else {
    conv_02.width_ = 0;
    conv_02.conv_ = conv_local.conv_;
    conv_02.flags_ = conv_local.flags_;
    conv_02.length_mod_ = conv_local.length_mod_;
    conv_02._3_1_ = conv_local._3_1_;
    conv_02.precision_ = as_digits.storage_._40_4_;
    local_9 = anon_unknown_53::ConvertIntImplInnerSlow
                        ((anon_unknown_53 *)local_90,local_38,conv_02,sink);
  }
  return local_9;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}